

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode singleipconnect(Curl_easy *data,connectdata *conn,Curl_addrinfo *ai,int tempindex)

{
  uint uVar1;
  _Bool _Var2;
  uint scope;
  int iVar3;
  curl_socket_t *pcVar4;
  uint *puVar5;
  int *piVar6;
  char *pcVar7;
  curltime cVar8;
  bool local_251;
  undefined4 uStack_234;
  curl_socket_t *sockp;
  char buffer [256];
  char *local_120;
  char *ipmsg;
  bool local_10d;
  int optval;
  char local_108 [3];
  _Bool is_tcp;
  int port;
  char ipaddress [46];
  uint local_d0;
  CURLcode result;
  curl_socket_t sockfd;
  int iStack_c4;
  _Bool isconnected;
  int error;
  int rc;
  Curl_sockaddr_ex addr;
  int tempindex_local;
  Curl_addrinfo *ai_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  iStack_c4 = 0xffffffff;
  sockfd = 0;
  result._3_1_ = CURLE_OK >> 0x18;
  ipmsg._4_4_ = 1;
  pcVar4 = conn->tempsock + tempindex;
  *pcVar4 = -1;
  addr._sa_ex_u._124_4_ = tempindex;
  register0x00000000 = Curl_socket(data,ai,(Curl_sockaddr_ex *)&error,(curl_socket_t *)&local_d0);
  data_local._4_4_ = register0x00000000;
  if (register0x00000000 == CURLE_OK) {
    _Var2 = Curl_addr2string((sockaddr *)&addr.protocol,addr.socktype,local_108,&optval);
    if (_Var2) {
      if (error == 10) {
        local_120 = "  Trying [%s]:%d...";
      }
      else {
        local_120 = "  Trying %s:%d...";
      }
      Curl_infof(data,local_120,local_108,(ulong)(uint)optval);
      if ((error == 2) || (local_251 = false, error == 10)) {
        local_251 = rc == 1;
      }
      local_10d = local_251;
      if ((local_251 != false) && ((*(ulong *)&(data->set).field_0x8e2 >> 0x20 & 1) != 0)) {
        tcpnodelay(data,local_d0);
      }
      if (((local_10d & 1U) != 0) && ((*(ulong *)&(data->set).field_0x8e2 >> 0x26 & 1) != 0)) {
        tcpkeepalive(data,local_d0);
      }
      if ((data->set).fsockopt != (curl_sockopt_callback)0x0) {
        Curl_set_in_callback(data,true);
        sockfd = (*(data->set).fsockopt)((data->set).sockopt_client,local_d0,CURLSOCKTYPE_IPCXN);
        Curl_set_in_callback(data,false);
        if (sockfd == 2) {
          result._3_1_ = 1;
        }
        else if (sockfd != 0) {
          Curl_closesocket(data,conn,local_d0);
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      uVar1 = local_d0;
      if ((error == 2) || (error == 10)) {
        scope = Curl_ipv6_scope((sockaddr *)&addr.protocol);
        register0x00000000 = bindlocal(data,uVar1,error,scope);
        if (register0x00000000 != CURLE_OK) {
          Curl_closesocket(data,conn,local_d0);
          if (stack0xffffffffffffff2c == CURLE_UNSUPPORTED_PROTOCOL) {
            return CURLE_COULDNT_CONNECT;
          }
          return stack0xffffffffffffff2c;
        }
      }
      curlx_nonblock(local_d0,1);
      cVar8 = Curl_now();
      (conn->connecttime).tv_sec = cVar8.tv_sec;
      *(ulong *)&(conn->connecttime).tv_usec = CONCAT44(uStack_234,cVar8.tv_usec);
      if (1 < conn->num_addr) {
        Curl_expire(data,conn->timeoutms_per_addr[0],EXPIRE_DNS_PER_NAME);
        Curl_expire(data,conn->timeoutms_per_addr[1],EXPIRE_DNS_PER_NAME2);
      }
      if (((result._3_1_ & 1) == CURLE_OK >> 0x18) && (conn->transport != '\x04')) {
        if ((*(uint *)&(conn->bits).field_0x4 >> 0x19 & 1) == 0) {
          iStack_c4 = connect(local_d0,(sockaddr *)&addr.protocol,addr.socktype);
        }
        else {
          iVar3 = setsockopt(local_d0,6,0x1e,(void *)((long)&ipmsg + 4),4);
          if (iVar3 < 0) {
            Curl_infof(data,"Failed to enable TCP Fast Open on fd %d",(ulong)local_d0);
          }
          iStack_c4 = connect(local_d0,(sockaddr *)&addr.protocol,addr.socktype);
        }
        if (iStack_c4 == -1) {
          piVar6 = __errno_location();
          sockfd = *piVar6;
        }
        if (iStack_c4 == -1) {
          if ((sockfd == 0xb) || (sockfd == 0x73)) {
            stack0xffffffffffffff2c = CURLE_OK;
          }
          else {
            pcVar7 = Curl_strerror(sockfd,(char *)&sockp,0x100);
            Curl_infof(data,"Immediate connect fail for %s: %s",local_108,pcVar7);
            (data->state).os_errno = sockfd;
            Curl_closesocket(data,conn,local_d0);
            stack0xffffffffffffff2c = CURLE_COULDNT_CONNECT;
          }
        }
        if (stack0xffffffffffffff2c == CURLE_OK) {
          *pcVar4 = local_d0;
        }
        data_local._4_4_ = stack0xffffffffffffff2c;
      }
      else {
        *pcVar4 = local_d0;
        data_local._4_4_ = CURLE_OK;
      }
    }
    else {
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      piVar6 = __errno_location();
      pcVar7 = Curl_strerror(*piVar6,(char *)&sockp,0x100);
      Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar7);
      Curl_closesocket(data,conn,local_d0);
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode singleipconnect(struct Curl_easy *data,
                                struct connectdata *conn,
                                const struct Curl_addrinfo *ai,
                                int tempindex)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  int port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif
  const char *ipmsg;
  char buffer[STRERROR_LEN];
  curl_socket_t *sockp = &conn->tempsock[tempindex];
  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(data, ai, &addr, &sockfd);
  if(result)
    return result;

  /* store remote address and port used in this connection attempt */
  if(!Curl_addr2string((struct sockaddr*)&addr.sa_addr, addr.addrlen,
                       ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, sockfd);
    return CURLE_OK;
  }
#ifdef ENABLE_IPV6
  if(addr.family == AF_INET6)
    ipmsg = "  Trying [%s]:%d...";
  else
#endif
    ipmsg = "  Trying %s:%d...";
  infof(data, ipmsg, ipaddress, port);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, sockfd);

  nosigpipe(data, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(data, conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(data, conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1) {
    Curl_expire(data, conn->timeoutms_per_addr[0], EXPIRE_DNS_PER_NAME);
    Curl_expire(data, conn->timeoutms_per_addr[1], EXPIRE_DNS_PER_NAME2);
  }

  /* Connect TCP and QUIC sockets */
  if(!isconnected && (conn->transport != TRNSPRT_UDP)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d", sockfd);

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
#ifdef ENABLE_QUIC
    else if(conn->transport == TRNSPRT_QUIC) {
      /* pass in 'sockfd' separately since it hasn't been put into the
         tempsock array at this point */
      result = Curl_quic_connect(data, conn, sockfd, tempindex,
                                 &addr.sa_addr, addr.addrlen);
      if(result)
        error = SOCKERRNO;
    }
#endif
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(data, conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}